

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

iterator __thiscall
llvm::SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>::
insert(SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
       *this,iterator I,unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *Elt)

{
  iterator puVar1;
  void *pvVar2;
  long lVar3;
  long *plVar4;
  DWARFUnit *pDVar5;
  DWARFUnit *pDVar6;
  uint uVar7;
  ulong uVar8;
  long *plVar9;
  long lVar10;
  
  puVar1 = (iterator)
           (this->
           super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
           ).
           super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
           .super_SmallVectorBase.BeginX;
  uVar7 = (this->
          super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
          ).
          super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
          .super_SmallVectorBase.Size;
  if (puVar1 + uVar7 == I) {
    SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
    ::push_back(&this->
                 super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                ,Elt);
    I = (iterator)
        ((long)(this->
               super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
               ).
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               .super_SmallVectorBase.BeginX +
        (ulong)(this->
               super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
               ).
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               .super_SmallVectorBase.Size * 8 + -8);
  }
  else {
    if (I < puVar1) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0x1d9,
                    "iterator llvm::SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit>>::insert(iterator, T &&) [T = std::unique_ptr<llvm::DWARFUnit>]"
                   );
    }
    if (puVar1 + uVar7 < I) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0x1da,
                    "iterator llvm::SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit>>::insert(iterator, T &&) [T = std::unique_ptr<llvm::DWARFUnit>]"
                   );
    }
    if ((this->
        super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
        ).
        super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
        .super_SmallVectorBase.Capacity <= uVar7) {
      SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
      ::grow(&this->
              super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
             ,0);
      I = (iterator)
          ((long)I +
          ((long)(this->
                 super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                 ).
                 super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                 .super_SmallVectorBase.BeginX - (long)puVar1));
    }
    uVar8 = (ulong)(this->
                   super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                   ).
                   super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                   .super_SmallVectorBase.Size;
    if (uVar8 == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0xa7,
                    "reference llvm::SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit>>::back() [T = std::unique_ptr<llvm::DWARFUnit>]"
                   );
    }
    pvVar2 = (this->
             super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
             ).
             super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
             .super_SmallVectorBase.BeginX;
    *(undefined8 *)((long)pvVar2 + uVar8 * 8) = *(undefined8 *)((long)pvVar2 + uVar8 * 8 + -8);
    *(undefined8 *)((long)pvVar2 + uVar8 * 8 + -8) = 0;
    plVar9 = (long *)((long)(this->
                            super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                            ).
                            super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                            .super_SmallVectorBase.BeginX + uVar8 * 8 + -8);
    lVar10 = (long)plVar9 - (long)I >> 3;
    if (0 < lVar10) {
      lVar10 = lVar10 + 1;
      do {
        lVar3 = plVar9[-1];
        plVar4 = (long *)*plVar9;
        plVar9[-1] = 0;
        *plVar9 = lVar3;
        if (plVar4 != (long *)0x0) {
          (**(code **)(*plVar4 + 8))();
        }
        plVar9 = plVar9 + -1;
        lVar10 = lVar10 + -1;
      } while (1 < lVar10);
    }
    uVar7 = (this->
            super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
            ).
            super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
            .super_SmallVectorBase.Size;
    if ((this->
        super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
        ).
        super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
        .super_SmallVectorBase.Capacity <= uVar7) {
      __assert_fail("N <= capacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
    }
    uVar7 = uVar7 + 1;
    (this->
    super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
    ).
    super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
    .super_SmallVectorBase.Size = uVar7;
    lVar10 = 0;
    if (I <= Elt) {
      lVar10 = (ulong)(Elt < (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                             ((ulong)uVar7 * 8 +
                             (long)(this->
                                   super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
                                   ).
                                   super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                                   .super_SmallVectorBase.BeginX)) << 3;
    }
    pDVar5 = *(DWARFUnit **)
              ((long)&(Elt->_M_t).
                      super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                      .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl + lVar10);
    *(undefined8 *)
     ((long)&(Elt->_M_t).
             super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
             super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
             super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl + lVar10) = 0;
    pDVar6 = (I->_M_t).super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
             ._M_t.super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
             super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
    (I->_M_t).super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
    super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
    super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl = pDVar5;
    if (pDVar6 != (DWARFUnit *)0x0) {
      (*pDVar6->_vptr_DWARFUnit[1])();
    }
  }
  return I;
}

Assistant:

iterator insert(iterator I, T &&Elt) {
    if (I == this->end()) {  // Important special case for empty vector.
      this->push_back(::std::move(Elt));
      return this->end()-1;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    if (this->size() >= this->capacity()) {
      size_t EltNo = I-this->begin();
      this->grow();
      I = this->begin()+EltNo;
    }

    ::new ((void*) this->end()) T(::std::move(this->back()));
    // Push everything else over.
    std::move_backward(I, this->end()-1, this->end());
    this->set_size(this->size() + 1);

    // If we just moved the element we're inserting, be sure to update
    // the reference.
    T *EltPtr = &Elt;
    if (I <= EltPtr && EltPtr < this->end())
      ++EltPtr;

    *I = ::std::move(*EltPtr);
    return I;
  }